

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O3

QWidget * __thiscall QtMWidgets::ScrollArea::takeWidget(ScrollArea *this)

{
  AbstractScrollAreaPrivate *pAVar1;
  _func_int **pp_Var2;
  AbstractScrollArea *pAVar3;
  
  pAVar1 = (this->super_AbstractScrollArea).d.d;
  if ((pAVar1[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
     (*(int *)((long)pAVar1[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) {
    pAVar3 = (AbstractScrollArea *)0x0;
  }
  else {
    pAVar3 = pAVar1[1].q;
  }
  QObject::removeEventFilter((QObject *)pAVar3);
  QWidget::setParent(&pAVar1->horIndicator->super_QWidget);
  QWidget::setParent(&pAVar1->vertIndicator->super_QWidget);
  QWidget::setParent(&pAVar1->horBlur->super_QWidget);
  QWidget::setParent(&pAVar1->vertBlur->super_QWidget);
  pp_Var2 = pAVar1[1]._vptr_AbstractScrollAreaPrivate;
  pAVar1[1]._vptr_AbstractScrollAreaPrivate = (_func_int **)0x0;
  pAVar1[1].q = (AbstractScrollArea *)0x0;
  if (pp_Var2 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var2 = *(int *)pp_Var2 + -1;
    UNLOCK();
    if (*(int *)pp_Var2 == 0) {
      operator_delete(pp_Var2);
    }
  }
  QWidget::setParent((QWidget *)pAVar3);
  return (QWidget *)pAVar3;
}

Assistant:

QWidget *
ScrollArea::takeWidget()
{
	ScrollAreaPrivate * d = d_func();
	QWidget * w = d->widget;
	w->removeEventFilter( this );
	d->horIndicator->setParent( d->viewport );
	d->vertIndicator->setParent( d->viewport );
	d->horBlur->setParent( d->viewport );
	d->vertBlur->setParent( d->viewport );
	d->widget = 0;
	if( w )
		w->setParent( 0 );
	return w;
}